

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O0

unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_> __thiscall
CCoinsViewDB::Cursor(CCoinsViewDB *this)

{
  undefined1 uVar1;
  pointer pCVar2;
  uchar *in_RSI;
  __uniq_ptr_data<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>,_true,_true> in_RDI;
  long in_FS_OFFSET;
  __single_object i;
  CoinEntry entry;
  CoinEntry *in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff68;
  char in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  CDBIterator *this_00;
  CDBWrapper *in_stack_ffffffffffffff98;
  CDBIterator *in_stack_ffffffffffffffa0;
  unique_ptr<CCoinsViewDBCursor,_std::default_delete<CCoinsViewDBCursor>_> local_40 [2];
  char local_30;
  CDBIterator local_28 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::operator*
            ((unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
  CDBWrapper::NewIterator(in_stack_ffffffffffffff98);
  this_00 = local_28;
  GetBestBlock((CCoinsViewDB *)
               CONCAT17(in_stack_ffffffffffffff6f,
                        CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
  std::make_unique<CCoinsViewDBCursor,CDBIterator*,uint256>
            ((CDBIterator **)local_40,(uint256 *)this_00);
  std::unique_ptr<CCoinsViewDBCursor,_std::default_delete<CCoinsViewDBCursor>_>::operator->
            ((unique_ptr<CCoinsViewDBCursor,_std::default_delete<CCoinsViewDBCursor>_> *)
             in_stack_ffffffffffffff58);
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::operator->
            ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)in_stack_ffffffffffffff58
            );
  CDBIterator::Seek<unsigned_char>(this_00,in_RSI);
  std::unique_ptr<CCoinsViewDBCursor,_std::default_delete<CCoinsViewDBCursor>_>::operator->
            ((unique_ptr<CCoinsViewDBCursor,_std::default_delete<CCoinsViewDBCursor>_> *)
             in_stack_ffffffffffffff58);
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::operator->
            ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)in_stack_ffffffffffffff58
            );
  uVar1 = CDBIterator::Valid((CDBIterator *)in_stack_ffffffffffffff58);
  if ((bool)uVar1) {
    std::unique_ptr<CCoinsViewDBCursor,_std::default_delete<CCoinsViewDBCursor>_>::operator->
              ((unique_ptr<CCoinsViewDBCursor,_std::default_delete<CCoinsViewDBCursor>_> *)
               in_stack_ffffffffffffff58);
    anon_unknown.dwarf_22c0cd2::CoinEntry::CoinEntry
              (in_stack_ffffffffffffff58,(COutPoint *)0x141ce03);
    std::unique_ptr<CCoinsViewDBCursor,_std::default_delete<CCoinsViewDBCursor>_>::operator->
              ((unique_ptr<CCoinsViewDBCursor,_std::default_delete<CCoinsViewDBCursor>_> *)
               in_stack_ffffffffffffff58);
    std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::operator->
              ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)
               in_stack_ffffffffffffff58);
    CDBIterator::GetKey<(anonymous_namespace)::CoinEntry>
              (in_stack_ffffffffffffffa0,(CoinEntry *)in_stack_ffffffffffffff98);
    pCVar2 = std::unique_ptr<CCoinsViewDBCursor,_std::default_delete<CCoinsViewDBCursor>_>::
             operator->((unique_ptr<CCoinsViewDBCursor,_std::default_delete<CCoinsViewDBCursor>_> *)
                        in_stack_ffffffffffffff58);
    (pCVar2->keyTmp).first = local_30;
    in_stack_ffffffffffffff6e = local_30;
  }
  else {
    pCVar2 = std::unique_ptr<CCoinsViewDBCursor,_std::default_delete<CCoinsViewDBCursor>_>::
             operator->((unique_ptr<CCoinsViewDBCursor,_std::default_delete<CCoinsViewDBCursor>_> *)
                        in_stack_ffffffffffffff58);
    (pCVar2->keyTmp).first = '\0';
  }
  std::unique_ptr<CCoinsViewCursor,std::default_delete<CCoinsViewCursor>>::
  unique_ptr<CCoinsViewDBCursor,std::default_delete<CCoinsViewDBCursor>,void>
            ((unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_> *)
             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),local_40)
  ;
  std::unique_ptr<CCoinsViewDBCursor,_std::default_delete<CCoinsViewDBCursor>_>::~unique_ptr
            ((unique_ptr<CCoinsViewDBCursor,_std::default_delete<CCoinsViewDBCursor>_> *)
             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (__uniq_ptr_data<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>,_true,_true>)
           (tuple<CCoinsViewCursor_*,_std::default_delete<CCoinsViewCursor>_>)
           in_RDI.super___uniq_ptr_impl<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_>.
           _M_t.super__Tuple_impl<0UL,_CCoinsViewCursor_*,_std::default_delete<CCoinsViewCursor>_>.
           super__Head_base<0UL,_CCoinsViewCursor_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<CCoinsViewCursor> CCoinsViewDB::Cursor() const
{
    auto i = std::make_unique<CCoinsViewDBCursor>(
        const_cast<CDBWrapper&>(*m_db).NewIterator(), GetBestBlock());
    /* It seems that there are no "const iterators" for LevelDB.  Since we
       only need read operations on it, use a const-cast to get around
       that restriction.  */
    i->pcursor->Seek(DB_COIN);
    // Cache key of first record
    if (i->pcursor->Valid()) {
        CoinEntry entry(&i->keyTmp.second);
        i->pcursor->GetKey(entry);
        i->keyTmp.first = entry.key;
    } else {
        i->keyTmp.first = 0; // Make sure Valid() and GetKey() return false
    }
    return i;
}